

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::BlindTxInRequest::BlindTxInRequest
          (BlindTxInRequest *this,BlindTxInRequest *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::js::api::json::BlindTxInRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__BlindTxInRequest_00a84670;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->txid_)._M_dataplus._M_p = (pointer)&(this->txid_).field_2;
  pcVar1 = (param_1->txid_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->txid_,pcVar1,pcVar1 + (param_1->txid_)._M_string_length);
  this->vout_ = param_1->vout_;
  (this->asset_)._M_dataplus._M_p = (pointer)&(this->asset_).field_2;
  pcVar1 = (param_1->asset_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->asset_,pcVar1,pcVar1 + (param_1->asset_)._M_string_length);
  (this->blind_factor_)._M_dataplus._M_p = (pointer)&(this->blind_factor_).field_2;
  pcVar1 = (param_1->blind_factor_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->blind_factor_,pcVar1,
             pcVar1 + (param_1->blind_factor_)._M_string_length);
  (this->asset_blind_factor_)._M_dataplus._M_p = (pointer)&(this->asset_blind_factor_).field_2;
  pcVar1 = (param_1->asset_blind_factor_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->asset_blind_factor_,pcVar1,
             pcVar1 + (param_1->asset_blind_factor_)._M_string_length);
  this->amount_ = param_1->amount_;
  return;
}

Assistant:

BlindTxInRequest() {
    CollectFieldName();
  }